

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSerializeEngine::XSerializeEngine
          (XSerializeEngine *this,BinInputStream *inStream,XMLGrammarPool *gramPool,
          XMLSize_t bufSize)

{
  int iVar1;
  undefined4 extraout_var;
  ValueVectorOf<void_*> *this_00;
  XMLByte *pXVar2;
  
  this->fStoreLoad = 1;
  this->fStorerLevel = 0;
  this->fGrammarPool = gramPool;
  this->fInputStream = inStream;
  this->fOutputStream = (BinOutputStream *)0x0;
  this->fBufCount = 0;
  this->fBufSize = bufSize;
  iVar1 = (*gramPool->fMemMgr->_vptr_MemoryManager[3])(gramPool->fMemMgr,bufSize);
  pXVar2 = (XMLByte *)CONCAT44(extraout_var,iVar1);
  this->fBufStart = pXVar2;
  this->fBufEnd = (XMLByte *)0x0;
  this->fBufCur = pXVar2;
  this->fBufLoadMax = pXVar2;
  this->fStorePool = (RefHashTableOf<xercesc_4_0::XSerializedObjectId,_xercesc_4_0::PtrHasher> *)0x0
  ;
  this_00 = (ValueVectorOf<void_*> *)XMemory::operator_new(0x28,gramPool->fMemMgr);
  ValueVectorOf<void_*>::ValueVectorOf(this_00,0x1d,gramPool->fMemMgr,false);
  this->fLoadPool = this_00;
  this->fObjectCount = 0;
  fillBuffer(this);
  return;
}

Assistant:

XSerializeEngine::XSerializeEngine(BinInputStream*         inStream
                                 , XMLGrammarPool* const   gramPool
                                 , XMLSize_t               bufSize)
:fStoreLoad(mode_Load)
,fStorerLevel(0)
,fGrammarPool(gramPool)
,fInputStream(inStream)
,fOutputStream(0)
,fBufCount(0)
,fBufSize(bufSize)
,fBufStart( (XMLByte*) gramPool->getMemoryManager()->allocate(bufSize))
,fBufEnd(0)
,fBufCur(fBufStart)
,fBufLoadMax(fBufStart)
,fStorePool(0)
,fLoadPool( new (gramPool->getMemoryManager()) ValueVectorOf<void*>(29, gramPool->getMemoryManager(), false))
,fObjectCount(0)
{
    /***
     *  initialize buffer from the inStream
     ***/
    fillBuffer();

}